

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O0

int Nwk_ManCompareAndSaveBest(Nwk_Man_t *pNtk,void *pNtl)

{
  int iVar1;
  void *pNtl_local;
  Nwk_Man_t *pNtk_local;
  
  if (pNtk == (Nwk_Man_t *)0x0) {
    if (Nwk_ManCompareAndSaveBest::ParsBest.pName != (char *)0x0) {
      free(Nwk_ManCompareAndSaveBest::ParsBest.pName);
      Nwk_ManCompareAndSaveBest::ParsBest.pName = (char *)0x0;
    }
    pNtk_local._4_4_ = 0;
  }
  else {
    Nwk_ManCompareAndSaveBest::ParsNew.Depth = Nwk_ManLevel(pNtk);
    Nwk_ManCompareAndSaveBest::ParsNew.Flops = Nwk_ManLatchNum(pNtk);
    Nwk_ManCompareAndSaveBest::ParsNew.Nodes = Nwk_ManNodeNum(pNtk);
    Nwk_ManCompareAndSaveBest::ParsNew.nPis = Nwk_ManPiNum(pNtk);
    Nwk_ManCompareAndSaveBest::ParsNew.nPos = Nwk_ManPoNum(pNtk);
    if (((((Nwk_ManCompareAndSaveBest::ParsBest.pName == (char *)0x0) ||
          (iVar1 = strcmp(Nwk_ManCompareAndSaveBest::ParsBest.pName,pNtk->pName), iVar1 != 0)) ||
         (Nwk_ManCompareAndSaveBest::ParsNew.Depth < Nwk_ManCompareAndSaveBest::ParsBest.Depth)) ||
        ((Nwk_ManCompareAndSaveBest::ParsBest.Depth == Nwk_ManCompareAndSaveBest::ParsNew.Depth &&
         (Nwk_ManCompareAndSaveBest::ParsNew.Flops < Nwk_ManCompareAndSaveBest::ParsBest.Flops))))
       || ((Nwk_ManCompareAndSaveBest::ParsBest.Depth == Nwk_ManCompareAndSaveBest::ParsNew.Depth &&
           ((Nwk_ManCompareAndSaveBest::ParsBest.Flops == Nwk_ManCompareAndSaveBest::ParsNew.Flops
            && (Nwk_ManCompareAndSaveBest::ParsNew.Nodes < Nwk_ManCompareAndSaveBest::ParsBest.Nodes
               )))))) {
      if (Nwk_ManCompareAndSaveBest::ParsBest.pName != (char *)0x0) {
        free(Nwk_ManCompareAndSaveBest::ParsBest.pName);
        Nwk_ManCompareAndSaveBest::ParsBest.pName = (char *)0x0;
      }
      Nwk_ManCompareAndSaveBest::ParsBest.pName = Abc_UtilStrsav(pNtk->pName);
      Nwk_ManCompareAndSaveBest::ParsBest.Depth = Nwk_ManCompareAndSaveBest::ParsNew.Depth;
      Nwk_ManCompareAndSaveBest::ParsBest.Flops = Nwk_ManCompareAndSaveBest::ParsNew.Flops;
      Nwk_ManCompareAndSaveBest::ParsBest.Nodes = Nwk_ManCompareAndSaveBest::ParsNew.Nodes;
      Nwk_ManCompareAndSaveBest::ParsBest.nPis = Nwk_ManCompareAndSaveBest::ParsNew.nPis;
      Nwk_ManCompareAndSaveBest::ParsBest.nPos = Nwk_ManCompareAndSaveBest::ParsNew.nPos;
      pNtk_local._4_4_ = 1;
    }
    else {
      pNtk_local._4_4_ = 0;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Nwk_ManCompareAndSaveBest( Nwk_Man_t * pNtk, void * pNtl )
{
//    extern void Ntl_WriteBlifLogic( Nwk_Man_t * pNtk, void * pNtl, char * pFileName );
    extern void Nwk_ManDumpBlif( Nwk_Man_t * pNtk, char * pFileName, Vec_Ptr_t * vPiNames, Vec_Ptr_t * vPoNames );
    static struct ParStruct {
        char * pName;  // name of the best saved network
        int    Depth;  // depth of the best saved network
        int    Flops;  // flops in the best saved network 
        int    Nodes;  // nodes in the best saved network
        int    nPis;   // the number of primary inputs
        int    nPos;   // the number of primary outputs
    } ParsNew, ParsBest = { 0 };
    // free storage for the name
    if ( pNtk == NULL )
    {
        ABC_FREE( ParsBest.pName );
        return 0;
    }
    // get the parameters
    ParsNew.Depth = Nwk_ManLevel( pNtk );
    ParsNew.Flops = Nwk_ManLatchNum( pNtk );
    ParsNew.Nodes = Nwk_ManNodeNum( pNtk );
    ParsNew.nPis  = Nwk_ManPiNum( pNtk );
    ParsNew.nPos  = Nwk_ManPoNum( pNtk );
    // reset the parameters if the network has the same name
    if (  ParsBest.pName == NULL ||
          strcmp(ParsBest.pName, pNtk->pName) ||
          ParsBest.Depth >  ParsNew.Depth ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops >  ParsNew.Flops) ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops == ParsNew.Flops && ParsBest.Nodes >  ParsNew.Nodes) )
    {
        ABC_FREE( ParsBest.pName );
        ParsBest.pName = Abc_UtilStrsav( pNtk->pName );
        ParsBest.Depth = ParsNew.Depth; 
        ParsBest.Flops = ParsNew.Flops; 
        ParsBest.Nodes = ParsNew.Nodes; 
        ParsBest.nPis  = ParsNew.nPis; 
        ParsBest.nPos  = ParsNew.nPos;
        // write the network
//        Ntl_WriteBlifLogic( pNtk, pNtl, "best.blif" );
//        Nwk_ManDumpBlif( pNtk, "best_map.blif", NULL, NULL );
        return 1;
    }
    return 0;
}